

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

int mp_check(char **data,char *end)

{
  char *pcVar1;
  byte bVar2;
  uint8_t uVar3;
  uint16_t uVar4;
  int iVar5;
  uint uVar6;
  uint32_t uVar7;
  undefined1 local_498 [8];
  mp_check_error err_22;
  mp_check_error err_21;
  mp_check_error err_20;
  mp_check_error err_19;
  mp_check_error err_18;
  mp_check_error err_17;
  mp_check_error err_16;
  mp_check_error err_15;
  mp_check_error err_14;
  mp_check_error err_13;
  mp_check_error err_12;
  mp_check_error err_11;
  mp_check_error err_10;
  mp_check_error err_9;
  mp_check_error err_8;
  mp_check_error err_7;
  mp_check_error err_6;
  mp_check_error err_5;
  mp_check_error err_4;
  mp_check_error err_3;
  mp_check_error err_2;
  mp_check_error err_1;
  int8_t type;
  uint32_t len;
  int l;
  uint8_t c;
  mp_check_error err;
  char *pos;
  int64_t k;
  char *begin;
  char *end_local;
  char **data_local;
  
  pcVar1 = *data;
  pos = (char *)0x1;
  do {
    if ((long)pos < 1) {
      if (*data <= end) {
        return 0;
      }
      __assert_fail("*data <= end",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h"
                    ,0xd35,"int mp_check(const char **, const char *)");
    }
    err.end = *data;
    err._40_8_ = err.end;
    if (end == *data) {
      l = 0;
      err.pos = pos;
      err._0_8_ = pcVar1;
      err.data = end;
      (*mp_check_on_error)((mp_check_error *)&l);
      return 1;
    }
    bVar2 = mp_load_u8(data);
    iVar5 = (int)""[bVar2];
    if (iVar5 < 0) {
      if (iVar5 < -0x1f) {
        switch(iVar5) {
        case -0x2a:
          local_498._0_4_ = MP_CHECK_ERROR_ILL;
          err_22.end = (char *)err._40_8_;
          err_22._0_8_ = pcVar1;
          err_22.data = end;
          (*mp_check_on_error)((mp_check_error *)local_498);
          return 1;
        case -0x29:
          if ((ulong)((long)end - (long)*data) < 5) {
            err_20.ext_type = '\0';
            err_20._41_3_ = 0;
            err_19.end = (char *)err._40_8_;
            err_19.pos = pos;
            err_19._0_8_ = pcVar1;
            err_19.data = end;
            (*mp_check_on_error)((mp_check_error *)&err_20.ext_type);
            return 1;
          }
          uVar7 = mp_load_u32(data);
          uVar3 = mp_load_u8(data);
          if ((ulong)((long)end - (long)*data) < (ulong)uVar7) {
            err_21.ext_type = '\0';
            err_21._41_3_ = 0;
            err_20.end = (char *)err._40_8_;
            err_20.pos = pos;
            err_20._0_8_ = pcVar1;
            err_20.data = end;
            (*mp_check_on_error)((mp_check_error *)&err_21.ext_type);
            return 1;
          }
          iVar5 = (*mp_check_ext_data)(uVar3,*data,uVar7);
          if (iVar5 != 0) {
            err_22.ext_type = '\x02';
            err_22._41_3_ = 0;
            err_21.end = *data;
            err_21._0_8_ = pcVar1;
            err_21.data = end;
            err_21.trunc_count._0_1_ = uVar3;
            err_21.trunc_count._4_4_ = uVar7;
            (*mp_check_on_error)((mp_check_error *)&err_22.ext_type);
            return 1;
          }
          *data = *data + uVar7;
          break;
        case -0x28:
          if ((ulong)((long)end - (long)*data) < 3) {
            err_17.ext_type = '\0';
            err_17._41_3_ = 0;
            err_16.end = (char *)err._40_8_;
            err_16.pos = pos;
            err_16._0_8_ = pcVar1;
            err_16.data = end;
            (*mp_check_on_error)((mp_check_error *)&err_17.ext_type);
            return 1;
          }
          uVar4 = mp_load_u16(data);
          uVar6 = (uint)uVar4;
          uVar3 = mp_load_u8(data);
          if ((ulong)((long)end - (long)*data) < (ulong)uVar6) {
            err_18.ext_type = '\0';
            err_18._41_3_ = 0;
            err_17.end = (char *)err._40_8_;
            err_17.pos = pos;
            err_17._0_8_ = pcVar1;
            err_17.data = end;
            (*mp_check_on_error)((mp_check_error *)&err_18.ext_type);
            return 1;
          }
          iVar5 = (*mp_check_ext_data)(uVar3,*data,uVar6);
          if (iVar5 != 0) {
            err_19.ext_type = '\x02';
            err_19._41_3_ = 0;
            err_18.end = *data;
            err_18._0_8_ = pcVar1;
            err_18.data = end;
            err_18.trunc_count._0_1_ = uVar3;
            err_18.trunc_count._4_4_ = uVar6;
            (*mp_check_on_error)((mp_check_error *)&err_19.ext_type);
            return 1;
          }
          *data = *data + uVar6;
          break;
        case -0x27:
          if ((ulong)((long)end - (long)*data) < 2) {
            err_14.ext_type = '\0';
            err_14._41_3_ = 0;
            err_13.end = (char *)err._40_8_;
            err_13.pos = pos;
            err_13._0_8_ = pcVar1;
            err_13.data = end;
            (*mp_check_on_error)((mp_check_error *)&err_14.ext_type);
            return 1;
          }
          bVar2 = mp_load_u8(data);
          uVar6 = (uint)bVar2;
          uVar3 = mp_load_u8(data);
          if ((ulong)((long)end - (long)*data) < (ulong)uVar6) {
            err_15.ext_type = '\0';
            err_15._41_3_ = 0;
            err_14.end = (char *)err._40_8_;
            err_14.pos = pos;
            err_14._0_8_ = pcVar1;
            err_14.data = end;
            (*mp_check_on_error)((mp_check_error *)&err_15.ext_type);
            return 1;
          }
          iVar5 = (*mp_check_ext_data)(uVar3,*data,uVar6);
          if (iVar5 != 0) {
            err_16.ext_type = '\x02';
            err_16._41_3_ = 0;
            err_15.end = *data;
            err_15._0_8_ = pcVar1;
            err_15.data = end;
            err_15.trunc_count._0_1_ = uVar3;
            err_15.trunc_count._4_4_ = uVar6;
            (*mp_check_on_error)((mp_check_error *)&err_16.ext_type);
            return 1;
          }
          *data = *data + uVar6;
          break;
        case -0x26:
          if ((ulong)((long)end - (long)*data) < 4) {
            err_13.ext_type = '\0';
            err_13._41_3_ = 0;
            err_12.end = (char *)err._40_8_;
            err_12.pos = pos;
            err_12._0_8_ = pcVar1;
            err_12.data = end;
            (*mp_check_on_error)((mp_check_error *)&err_13.ext_type);
            return 1;
          }
          uVar7 = mp_load_u32(data);
          pos = pos + (ulong)uVar7 * 2;
          break;
        case -0x25:
          if ((ulong)((long)end - (long)*data) < 2) {
            err_12.ext_type = '\0';
            err_12._41_3_ = 0;
            err_11.end = (char *)err._40_8_;
            err_11.pos = pos;
            err_11._0_8_ = pcVar1;
            err_11.data = end;
            (*mp_check_on_error)((mp_check_error *)&err_12.ext_type);
            return 1;
          }
          uVar4 = mp_load_u16(data);
          pos = pos + (ulong)uVar4 * 2;
          break;
        case -0x24:
          if ((ulong)((long)end - (long)*data) < 4) {
            err_11.ext_type = '\0';
            err_11._41_3_ = 0;
            err_10.end = (char *)err._40_8_;
            err_10.pos = pos;
            err_10._0_8_ = pcVar1;
            err_10.data = end;
            (*mp_check_on_error)((mp_check_error *)&err_11.ext_type);
            return 1;
          }
          uVar7 = mp_load_u32(data);
          pos = pos + uVar7;
          break;
        case -0x23:
          if ((ulong)((long)end - (long)*data) < 2) {
            err_10.ext_type = '\0';
            err_10._41_3_ = 0;
            err_9.end = (char *)err._40_8_;
            err_9.pos = pos;
            err_9._0_8_ = pcVar1;
            err_9.data = end;
            (*mp_check_on_error)((mp_check_error *)&err_10.ext_type);
            return 1;
          }
          uVar4 = mp_load_u16(data);
          pos = pos + uVar4;
          break;
        case -0x22:
          if ((ulong)((long)end - (long)*data) < 4) {
            err_8.ext_type = '\0';
            err_8._41_3_ = 0;
            err_7.end = (char *)err._40_8_;
            err_7.pos = pos;
            err_7._0_8_ = pcVar1;
            err_7.data = end;
            (*mp_check_on_error)((mp_check_error *)&err_8.ext_type);
            return 1;
          }
          uVar7 = mp_load_u32(data);
          if ((ulong)((long)end - (long)*data) < (ulong)uVar7) {
            err_9.ext_type = '\0';
            err_9._41_3_ = 0;
            err_8.end = (char *)err._40_8_;
            err_8.pos = pos;
            err_8._0_8_ = pcVar1;
            err_8.data = end;
            (*mp_check_on_error)((mp_check_error *)&err_9.ext_type);
            return 1;
          }
          *data = *data + uVar7;
          break;
        case -0x21:
          if ((ulong)((long)end - (long)*data) < 2) {
            err_6.ext_type = '\0';
            err_6._41_3_ = 0;
            err_5.end = (char *)err._40_8_;
            err_5.pos = pos;
            err_5._0_8_ = pcVar1;
            err_5.data = end;
            (*mp_check_on_error)((mp_check_error *)&err_6.ext_type);
            return 1;
          }
          uVar4 = mp_load_u16(data);
          if ((ulong)((long)end - (long)*data) < (ulong)(uint)uVar4) {
            err_7.ext_type = '\0';
            err_7._41_3_ = 0;
            err_6.end = (char *)err._40_8_;
            err_6.pos = pos;
            err_6._0_8_ = pcVar1;
            err_6.data = end;
            (*mp_check_on_error)((mp_check_error *)&err_7.ext_type);
            return 1;
          }
          *data = *data + (uint)uVar4;
          break;
        case -0x20:
          if (end == *data) {
            err_4.ext_type = '\0';
            err_4._41_3_ = 0;
            err_3.end = (char *)err._40_8_;
            err_3.pos = pos;
            err_3._0_8_ = pcVar1;
            err_3.data = end;
            (*mp_check_on_error)((mp_check_error *)&err_4.ext_type);
            return 1;
          }
          bVar2 = mp_load_u8(data);
          if ((ulong)((long)end - (long)*data) < (ulong)(uint)bVar2) {
            err_5.ext_type = '\0';
            err_5._41_3_ = 0;
            err_4.end = (char *)err._40_8_;
            err_4.pos = pos;
            err_4._0_8_ = pcVar1;
            err_4.data = end;
            (*mp_check_on_error)((mp_check_error *)&err_5.ext_type);
            return 1;
          }
          *data = *data + (uint)bVar2;
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h"
                        ,0xd31,"int mp_check(const char **, const char *)");
        }
      }
      else {
        pos = pos + -(long)iVar5;
      }
    }
    else {
      if ((ulong)((long)end - (long)*data) < (ulong)(long)iVar5) {
        err_2.ext_type = '\0';
        err_2._41_3_ = 0;
        (*mp_check_on_error)((mp_check_error *)&err_2.ext_type);
        return 1;
      }
      if (bVar2 < 0xd4 || 0xd8 < bVar2) {
        *data = *data + iVar5;
      }
      else {
        uVar6 = iVar5 - 1;
        uVar3 = mp_load_u8(data);
        iVar5 = (*mp_check_ext_data)(uVar3,*data,uVar6);
        if (iVar5 != 0) {
          err_3.ext_type = '\x02';
          err_3._41_3_ = 0;
          err_2.end = *data;
          err_2._0_8_ = pcVar1;
          err_2.data = end;
          err_2.trunc_count._0_1_ = uVar3;
          err_2.trunc_count._4_4_ = uVar6;
          (*mp_check_on_error)((mp_check_error *)&err_3.ext_type);
          return 1;
        }
        *data = *data + uVar6;
      }
    }
    pos = pos + -1;
  } while( true );
}

Assistant:

MP_IMPL int
mp_check(const char **data, const char *end)
{
	const char *begin = *data;

#define MP_CHECK_LEN(_l)						\
	if (mp_unlikely((size_t)(end - *data) < (size_t)(_l))) {	\
		struct mp_check_error err;				\
		err.type = MP_CHECK_ERROR_TRUNC;			\
		err.data = begin;					\
		err.end = end;						\
		err.pos = pos;						\
		err.trunc_count = k;					\
		mp_check_on_error(&err);				\
		return 1;						\
	}

#define MP_CHECK_EXT(_type, _data, _len)				\
	if (mp_check_ext_data((_type), (_data), (_len)) != 0) {		\
		struct mp_check_error err;				\
		err.type = MP_CHECK_ERROR_EXT;				\
		err.data = begin;					\
		err.end = end;						\
		err.pos = (_data);					\
		err.ext_type = (_type);					\
		err.ext_len = (_len);					\
		mp_check_on_error(&err);				\
		return 1;						\
	}

	int64_t k;
	for (k = 1; k > 0; k--) {
		const char *pos = *data;
		MP_CHECK_LEN(1);
		uint8_t c = mp_load_u8(data);
		int l = mp_parser_hint[c];
		uint32_t len;
		int8_t type;
		if (mp_likely(l >= 0)) {
			MP_CHECK_LEN(l);
			if (mp_unlikely(c >= 0xd4 && c <= 0xd8)) {
				/*
				 * Check MP_EXT contents. Everything but the
				 * first byte (which stands for ext type) is the
				 * payload.
				 */
				len = l - 1;
				type = mp_load_u8(data);
				MP_CHECK_EXT(type, *data, len);
				*data += len;
			} else {
				*data += l;
			}
			continue;
		} else if (mp_likely(l > MP_HINT)) {
			k -= l;
			continue;
		}

		switch (l) {
		case MP_HINT_STR_8:
			/* MP_STR (8) */
			MP_CHECK_LEN(sizeof(uint8_t));
			len = mp_load_u8(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		case MP_HINT_STR_16:
			/* MP_STR (16) */
			MP_CHECK_LEN(sizeof(uint16_t));
			len = mp_load_u16(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		case MP_HINT_STR_32:
			/* MP_STR (32) */
			MP_CHECK_LEN(sizeof(uint32_t))
			len = mp_load_u32(data);
			MP_CHECK_LEN(len);
			*data += len;
			break;
		case MP_HINT_ARRAY_16:
			/* MP_ARRAY (16) */
			MP_CHECK_LEN(sizeof(uint16_t));
			k += mp_load_u16(data);
			break;
		case MP_HINT_ARRAY_32:
			/* MP_ARRAY (32) */
			MP_CHECK_LEN(sizeof(uint32_t));
			k += mp_load_u32(data);
			break;
		case MP_HINT_MAP_16:
			/* MP_MAP (16) */
			MP_CHECK_LEN(sizeof(uint16_t));
			k += 2 * (uint32_t)mp_load_u16(data);
			break;
		case MP_HINT_MAP_32:
			/* MP_MAP (32) */
			MP_CHECK_LEN(sizeof(uint32_t));
			k += 2 * (uint64_t)mp_load_u32(data);
			break;
		case MP_HINT_EXT_8:
			/* MP_EXT (8) */
			MP_CHECK_LEN(sizeof(uint8_t) + sizeof(uint8_t));
			len = mp_load_u8(data);
			type = mp_load_u8(data);
			MP_CHECK_LEN(len);
			MP_CHECK_EXT(type, *data, len);
			*data += len;
			break;
		case MP_HINT_EXT_16:
			/* MP_EXT (16) */
			MP_CHECK_LEN(sizeof(uint16_t) + sizeof(uint8_t));
			len = mp_load_u16(data);
			type = mp_load_u8(data);
			MP_CHECK_LEN(len);
			MP_CHECK_EXT(type, *data, len);
			*data += len;
			break;
		case MP_HINT_EXT_32:
			/* MP_EXT (32) */
			MP_CHECK_LEN(sizeof(uint32_t) + sizeof(uint8_t));
			len = mp_load_u32(data);
			type = mp_load_u8(data);
			MP_CHECK_LEN(len);
			MP_CHECK_EXT(type, *data, len);
			*data += len;
			break;
		case MP_HINT_INVALID:
		{
			struct mp_check_error err;
			err.type = MP_CHECK_ERROR_ILL;
			err.data = begin;
			err.end = end;
			err.pos = pos;
			mp_check_on_error(&err);
			return 1;
		}
		default:
			mp_unreachable();
		}
	}

	assert(*data <= end);
#undef MP_CHECK_LEN
#undef MP_CHECK_EXT
	return 0;
}